

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O2

void olsrv2_generate_tcs(_Bool generate)

{
  uint64_t uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = _overwrite_tc_interval;
  if (_overwrite_tc_interval == 0) {
    uVar1 = _olsrv2_config.tc_interval;
  }
  if ((int)CONCAT71(in_register_00000039,generate) == 0) {
    if (_tc_timer._clock != 0) {
      oonf_timer_stop(&_tc_timer);
      return;
    }
  }
  else if (_tc_timer._clock == 0) {
    oonf_timer_set_ext(&_tc_timer,uVar1);
    return;
  }
  return;
}

Assistant:

void
olsrv2_generate_tcs(bool generate) {
  uint64_t interval;

  interval = _overwrite_tc_interval;
  if (!interval) {
    interval = _olsrv2_config.tc_interval;
  }
  if (generate && !oonf_timer_is_active(&_tc_timer)) {
    oonf_timer_set(&_tc_timer, interval);
  }
  else if (!generate && oonf_timer_is_active(&_tc_timer)) {
    oonf_timer_stop(&_tc_timer);
  }
}